

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::Option::transform
          (Option *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *func,string *transform_description,string *transform_name)

{
  const_iterator __position;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_b0;
  Validator local_90;
  
  __position._M_current =
       (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_b0,func);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Option::transform(std::function<std::__cxx11::string(std::__cxx11::string)>const&,std::__cxx11::string,std::__cxx11::string)::_lambda(std::__cxx11::string&)_1_,void>
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&local_110,
             (anon_class_32_1_898bcfc2 *)&local_b0);
  ::std::__cxx11::string::string
            (&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             transform_description);
  ::std::__cxx11::string::string
            (&local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)transform_name);
  Validator::Validator(&local_90,&local_110,(string *)&local_d0,(string *)&local_f0);
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&this->validators_,__position,&local_90);
  Validator::~Validator(&local_90);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_110);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  return this;
}

Assistant:

CLI11_INLINE Option *Option::transform(const std::function<std::string(std::string)> &func,
                                       std::string transform_description,
                                       std::string transform_name) {
    validators_.insert(validators_.begin(),
                       Validator(
                           [func](std::string &val) {
                               val = func(val);
                               return std::string{};
                           },
                           std::move(transform_description),
                           std::move(transform_name)));

    return this;
}